

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> * __thiscall
van_kampen::Diagramm::getCircuit
          (vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
           *__return_storage_ptr__,Diagramm *this)

{
  bool bVar1;
  nodeId_t nVar2;
  deque<van_kampen::Node,_std::allocator<van_kampen::Node>_> *pdVar3;
  reference pNVar4;
  deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *pdVar5;
  invalid_argument *this_00;
  _Elt_pointer pTVar6;
  int iVar7;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *pvVar8;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> local_48;
  
  local_48.super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Node::isNonexistantNode(this->terminal_);
  pvVar8 = __return_storage_ptr__;
  if (!bVar1) {
    pdVar3 = Graph::nodes((this->graph_).
                          super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pNVar4 = std::_Deque_iterator<van_kampen::Node,_van_kampen::Node_&,_van_kampen::Node_*>::
             operator[](&(pdVar3->
                         super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                         _M_impl.super__Deque_impl_data._M_start,(long)this->terminal_);
    nVar2 = Node::getId(pNVar4);
    iVar7 = nVar2;
    do {
      pdVar3 = Graph::nodes((this->graph_).
                            super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           );
      pNVar4 = std::_Deque_iterator<van_kampen::Node,_van_kampen::Node_&,_van_kampen::Node_*>::
               operator[](&(pdVar3->
                           super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                           _M_impl.super__Deque_impl_data._M_start,(long)iVar7);
      pdVar5 = Node::transitions(pNVar4);
      if ((pdVar5->
          super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (pdVar5->
          super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"diagram is not looped");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pdVar3 = Graph::nodes((this->graph_).
                            super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           );
      pNVar4 = std::_Deque_iterator<van_kampen::Node,_van_kampen::Node_&,_van_kampen::Node_*>::
               operator[](&(pdVar3->
                           super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                           _M_impl.super__Deque_impl_data._M_start,(long)iVar7);
      pdVar5 = Node::transitions(pNVar4);
      pTVar6 = (pdVar5->
               super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pTVar6 == (pdVar5->
                    super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                    )._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pTVar6 = (pdVar5->
                 super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>)
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 7;
      }
      std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::push_back
                (&local_48,pTVar6 + -1);
      iVar7 = local_48.
              super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1].to;
    } while (iVar7 != nVar2);
    (__return_storage_ptr__->
    super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl
         .super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    pvVar8 = &local_48;
  }
  (pvVar8->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar8->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar8->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Transition> Diagramm::getCircuit()
{
    std::vector<Transition> result{};

    if (Node::isNonexistantNode(terminal_))
    {
        return {};
    }

    nodeId_t firstNodeId = graph_->nodes()[terminal_].getId();
    nodeId_t curNodeId = firstNodeId;
    do
    {
        if (graph_->nodes()[curNodeId].transitions().empty())
        {
            throw std::invalid_argument("diagram is not looped");
        }
        else
        {
            result.push_back(graph_->nodes()[curNodeId].transitions().back());
            curNodeId = result.back().to;
        }
    } while (curNodeId != firstNodeId);

    return result;
}